

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O0

void __thiscall Diligent::DeviceContextGLImpl::EndSubpass(DeviceContextGLImpl *this)

{
  Uint32 UVar1;
  PFNGLINVALIDATEFRAMEBUFFERPROC p_Var2;
  uint uVar3;
  bool bVar4;
  GLuint GVar5;
  value_type_conflict vVar6;
  DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
  *this_00;
  Char *pCVar7;
  long lVar8;
  FramebufferGLImpl *pFVar9;
  SubpassFramebuffers *this_01;
  ISwapChainGL *pIVar10;
  RenderPassBase<Diligent::EngineGLImplTraits> *pRVar11;
  reference pvVar12;
  pair<unsigned_int,_unsigned_int> pVar13;
  pointer pvVar14;
  char (*in_RCX) [20];
  char (*Args_1) [109];
  size_type sVar15;
  GLuint local_204;
  undefined1 local_1d8 [8];
  string msg_8;
  undefined1 local_1b0 [4];
  GLenum err_2;
  string msg_7;
  TextureFormatAttribs *FmtAttribs;
  uint AttachmentLastUse_1;
  Uint32 DSAttachmentIdx;
  string msg_6;
  uint uStack_150;
  uint AttachmentLastUse;
  Uint32 RTAttachmentIdx;
  Uint32 rt;
  array<unsigned_int,_9UL> InvalidateAttachments;
  GLsizei InvalidateAttachmentsCount;
  FramebufferDesc *FBODesc;
  string msg_5;
  GLenum err_1;
  GLuint ResolveDstFBO;
  string msg_4;
  undefined1 local_c0 [4];
  GLuint glExpectedReadFB;
  string msg_3;
  GLenum err;
  GLint glCurrReadFB;
  SubpassFramebuffers *SubpassFBOs;
  SubpassDesc *SubpassDesc;
  string msg_2;
  RenderPassDesc *RPDesc;
  string msg_1;
  undefined1 local_30 [8];
  string msg;
  DeviceContextGLImpl *this_local;
  
  msg.field_2._8_8_ = this;
  bVar4 = RefCntAutoPtr<Diligent::RenderPassGLImpl>::operator!
                    (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                      m_pActiveRenderPass);
  if (bVar4) {
    FormatString<char[26],char[20]>
              ((string *)local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pActiveRenderPass",in_RCX);
    pCVar7 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [20])0x221;
    DebugAssertionFailed
              (pCVar7,"EndSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x221);
    std::__cxx11::string::~string((string *)local_30);
  }
  bVar4 = RefCntAutoPtr<Diligent::FramebufferGLImpl>::operator!
                    (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                      m_pBoundFramebuffer);
  if (bVar4) {
    FormatString<char[26],char[20]>
              ((string *)&RPDesc,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pBoundFramebuffer",in_RCX);
    pCVar7 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar7,"EndSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x222);
    std::__cxx11::string::~string((string *)&RPDesc);
  }
  this_00 = (DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
             *)RefCntAutoPtr<Diligent::RenderPassGLImpl>::operator->
                         (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                           m_pActiveRenderPass);
  msg_2.field_2._8_8_ =
       DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
       ::GetDesc(this_00);
  if (((RenderPassDesc *)msg_2.field_2._8_8_)->SubpassCount <=
      (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_SubpassIndex) {
    FormatString<char[26],char[37]>
              ((string *)&SubpassDesc,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_SubpassIndex < RPDesc.SubpassCount",
               (char (*) [37])msg_2.field_2._8_8_);
    pCVar7 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar7,"EndSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x224);
    std::__cxx11::string::~string((string *)&SubpassDesc);
  }
  lVar8 = *(long *)(msg_2.field_2._8_8_ + 0x20) +
          (ulong)(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_SubpassIndex * 0x48
  ;
  pFVar9 = RefCntAutoPtr<Diligent::FramebufferGLImpl>::operator->
                     (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                       m_pBoundFramebuffer);
  this_01 = FramebufferGLImpl::GetSubpassFramebuffer
                      (pFVar9,(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                              m_SubpassIndex);
  msg_3.field_2._12_4_ = 0;
  glGetIntegerv(0x8caa,(undefined1 *)((long)&msg_3.field_2 + 0xc));
  msg_3.field_2._8_4_ = glGetError();
  if (msg_3.field_2._8_4_ != 0) {
    LogError<false,char[39],char[17],unsigned_int>
              (false,"EndSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x22c,(char (*) [39])"Failed to get current read framebuffer",
               (char (*) [17])"\nGL Error Code: ",(uint *)(msg_3.field_2._M_local_buf + 8));
    FormatString<char[6]>((string *)local_c0,(char (*) [6])0xe8e72e);
    pCVar7 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar7,"EndSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x22c);
    std::__cxx11::string::~string((string *)local_c0);
  }
  GVar5 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int((GLObjWrapper *)this_01);
  if (GVar5 == 0) {
    pIVar10 = RefCntAutoPtr<Diligent::ISwapChainGL>::operator->(&this->m_pSwapChain);
    local_204 = (**(code **)(*(long *)pIVar10 + 0x60))();
  }
  else {
    local_204 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                          ((GLObjWrapper *)this_01);
  }
  msg_4.field_2._12_4_ = local_204;
  if (msg_3.field_2._12_4_ != local_204) {
    FormatString<char[28]>((string *)&err_1,(char (*) [28])"Unexpected read framebuffer");
    pCVar7 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar7,"EndSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x22e);
    std::__cxx11::string::~string((string *)&err_1);
  }
  if (*(long *)(lVar8 + 0x20) != 0) {
    msg_5.field_2._12_4_ =
         GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                   ((GLObjWrapper *)&this_01->Resolve);
    if (msg_5.field_2._12_4_ == 0) {
      pIVar10 = RefCntAutoPtr<Diligent::ISwapChainGL>::RawPtr<Diligent::ISwapChainGL>
                          (&this->m_pSwapChain);
      msg_5.field_2._12_4_ = (**(code **)(*(long *)pIVar10 + 0x60))();
    }
    (*__glewBindFramebuffer)(0x8ca9,msg_5.field_2._12_4_);
    msg_5.field_2._8_4_ = glGetError();
    if (msg_5.field_2._8_4_ != 0) {
      LogError<false,char[59],char[17],unsigned_int>
                (false,"EndSubpass",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x23a,(char (*) [59])"Failed to bind resolve destination FBO as draw framebuffer",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_5.field_2._M_local_buf + 8));
      FormatString<char[6]>((string *)&FBODesc,(char (*) [6])0xe8e72e);
      pCVar7 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar7,"EndSubpass",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x23a);
      std::__cxx11::string::~string((string *)&FBODesc);
    }
    pFVar9 = RefCntAutoPtr<Diligent::FramebufferGLImpl>::operator->
                       (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                         m_pBoundFramebuffer);
    register0x00000000 =
         DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
         ::GetDesc((DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                    *)pFVar9);
    GLContextState::BlitFramebufferNoScissor
              (&this->m_ContextState,0,0,register0x00000000->Width,register0x00000000->Height,0,0,
               register0x00000000->Width,register0x00000000->Height,0x4000,0x2600);
  }
  if (__glewInvalidateFramebuffer != (PFNGLINVALIDATEFRAMEBUFFERPROC)0x0) {
    InvalidateAttachments._M_elems[7] = 0;
    for (AttachmentLastUse = 0; AttachmentLastUse < *(uint *)(lVar8 + 0x10);
        AttachmentLastUse = AttachmentLastUse + 1) {
      UVar1 = *(Uint32 *)(*(long *)(lVar8 + 0x18) + (ulong)AttachmentLastUse * 8);
      if (UVar1 != 0xffffffff) {
        pRVar11 = &RefCntAutoPtr<Diligent::RenderPassGLImpl>::operator->
                             (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                               m_pActiveRenderPass)->
                   super_RenderPassBase<Diligent::EngineGLImplTraits>;
        register0x00000000 =
             RenderPassBase<Diligent::EngineGLImplTraits>::GetAttachmentFirstLastUse(pRVar11,UVar1);
        if ((uStack_150 ==
             (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_SubpassIndex) &&
           (*(char *)(*(long *)(msg_2.field_2._8_8_ + 0x10) + (ulong)UVar1 * 0x10 + 4) == '\x01')) {
          GVar5 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                            ((GLObjWrapper *)this_01);
          if (GVar5 == 0) {
            if (AttachmentLastUse != 0) {
              FormatString<char[58]>
                        ((string *)&AttachmentLastUse_1,
                         (char (*) [58])"Default framebuffer can only have single color attachment")
              ;
              pCVar7 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar7,"EndSubpass",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                         ,0x256);
              std::__cxx11::string::~string((string *)&AttachmentLastUse_1);
            }
            sVar15 = (size_type)(int)InvalidateAttachments._M_elems[7];
            InvalidateAttachments._M_elems[7] = InvalidateAttachments._M_elems[7] + 1;
            pvVar12 = std::array<unsigned_int,_9UL>::operator[]
                                ((array<unsigned_int,_9UL> *)&RTAttachmentIdx,sVar15);
            *pvVar12 = 0x1800;
          }
          else {
            sVar15 = (size_type)(int)InvalidateAttachments._M_elems[7];
            InvalidateAttachments._M_elems[7] = InvalidateAttachments._M_elems[7] + 1;
            pvVar12 = std::array<unsigned_int,_9UL>::operator[]
                                ((array<unsigned_int,_9UL> *)&RTAttachmentIdx,sVar15);
            *pvVar12 = AttachmentLastUse + 0x8ce0;
          }
        }
      }
    }
    if ((*(long *)(lVar8 + 0x28) != 0) && (UVar1 = **(Uint32 **)(lVar8 + 0x28), UVar1 != 0xffffffff)
       ) {
      pRVar11 = &RefCntAutoPtr<Diligent::RenderPassGLImpl>::operator->
                           (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                             m_pActiveRenderPass)->
                 super_RenderPassBase<Diligent::EngineGLImplTraits>;
      pVar13 = RenderPassBase<Diligent::EngineGLImplTraits>::GetAttachmentFirstLastUse
                         (pRVar11,UVar1);
      FmtAttribs._4_4_ = pVar13.second;
      if ((FmtAttribs._4_4_ ==
           (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_SubpassIndex) &&
         (*(char *)(*(long *)(msg_2.field_2._8_8_ + 0x10) + (ulong)UVar1 * 0x10 + 4) == '\x01')) {
        Args_1 = (char (*) [109])((ulong)UVar1 * 0x10);
        msg_7.field_2._8_8_ =
             GetTextureFormatAttribs
                       (*(TEXTURE_FORMAT *)(*Args_1 + *(long *)(msg_2.field_2._8_8_ + 0x10)));
        if ((((TextureFormatAttribs *)msg_7.field_2._8_8_)->ComponentType != COMPONENT_TYPE_DEPTH)
           && (((TextureFormatAttribs *)msg_7.field_2._8_8_)->ComponentType !=
               COMPONENT_TYPE_DEPTH_STENCIL)) {
          FormatString<char[26],char[109]>
                    ((string *)local_1b0,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])
                     "FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH || FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL"
                     ,Args_1);
          pCVar7 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar7,"EndSubpass",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                     ,0x26a);
          std::__cxx11::string::~string((string *)local_1b0);
        }
        GVar5 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                          ((GLObjWrapper *)this_01);
        if (GVar5 == 0) {
          sVar15 = (size_type)(int)InvalidateAttachments._M_elems[7];
          InvalidateAttachments._M_elems[7] = InvalidateAttachments._M_elems[7] + 1;
          pvVar12 = std::array<unsigned_int,_9UL>::operator[]
                              ((array<unsigned_int,_9UL> *)&RTAttachmentIdx,sVar15);
          *pvVar12 = 0x1801;
          if (*(char *)(msg_7.field_2._8_8_ + 0xc) == '\b') {
            sVar15 = (size_type)(int)InvalidateAttachments._M_elems[7];
            InvalidateAttachments._M_elems[7] = InvalidateAttachments._M_elems[7] + 1;
            pvVar12 = std::array<unsigned_int,_9UL>::operator[]
                                ((array<unsigned_int,_9UL> *)&RTAttachmentIdx,sVar15);
            *pvVar12 = 0x1802;
          }
        }
        else {
          vVar6 = 0x821a;
          if (*(char *)(msg_7.field_2._8_8_ + 0xc) == '\a') {
            vVar6 = 0x8d00;
          }
          sVar15 = (size_type)(int)InvalidateAttachments._M_elems[7];
          InvalidateAttachments._M_elems[7] = InvalidateAttachments._M_elems[7] + 1;
          pvVar12 = std::array<unsigned_int,_9UL>::operator[]
                              ((array<unsigned_int,_9UL> *)&RTAttachmentIdx,sVar15);
          *pvVar12 = vVar6;
        }
      }
    }
    uVar3 = InvalidateAttachments._M_elems[7];
    p_Var2 = __glewInvalidateFramebuffer;
    if (0 < (int)InvalidateAttachments._M_elems[7]) {
      pvVar14 = std::array<unsigned_int,_9UL>::data((array<unsigned_int,_9UL> *)&RTAttachmentIdx);
      (*p_Var2)(0x8ca8,uVar3,pvVar14);
      msg_8.field_2._12_4_ = glGetError();
      if (msg_8.field_2._12_4_ != 0) {
        LogError<false,char[33],char[17],unsigned_int>
                  (false,"EndSubpass",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                   ,0x27c,(char (*) [33])"glInvalidateFramebuffer() failed",
                   (char (*) [17])"\nGL Error Code: ",(uint *)(msg_8.field_2._M_local_buf + 0xc));
        FormatString<char[6]>((string *)local_1d8,(char (*) [6])0xe8e72e);
        pCVar7 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar7,"EndSubpass",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                   ,0x27c);
        std::__cxx11::string::~string((string *)local_1d8);
      }
    }
  }
  GLContextState::InvalidateFBO(&this->m_ContextState);
  return;
}

Assistant:

void DeviceContextGLImpl::EndSubpass()
{
    VERIFY_EXPR(m_pActiveRenderPass);
    VERIFY_EXPR(m_pBoundFramebuffer);
    const RenderPassDesc& RPDesc = m_pActiveRenderPass->GetDesc();
    VERIFY_EXPR(m_SubpassIndex < RPDesc.SubpassCount);
    const SubpassDesc& SubpassDesc = RPDesc.pSubpasses[m_SubpassIndex];

    const FramebufferGLImpl::SubpassFramebuffers& SubpassFBOs = m_pBoundFramebuffer->GetSubpassFramebuffer(m_SubpassIndex);
#ifdef DILIGENT_DEBUG
    {
        GLint glCurrReadFB = 0;
        glGetIntegerv(GL_READ_FRAMEBUFFER_BINDING, &glCurrReadFB);
        DEV_CHECK_GL_ERROR("Failed to get current read framebuffer");
        GLuint glExpectedReadFB = SubpassFBOs.RenderTarget != 0 ? static_cast<GLuint>(SubpassFBOs.RenderTarget) : m_pSwapChain->GetDefaultFBO();
        VERIFY(static_cast<GLuint>(glCurrReadFB) == glExpectedReadFB, "Unexpected read framebuffer");
    }
#endif

    if (SubpassDesc.pResolveAttachments != nullptr)
    {
        GLuint ResolveDstFBO = SubpassFBOs.Resolve;
        if (ResolveDstFBO == 0)
        {
            ResolveDstFBO = m_pSwapChain.RawPtr<ISwapChainGL>()->GetDefaultFBO();
        }
        glBindFramebuffer(GL_DRAW_FRAMEBUFFER, ResolveDstFBO);
        DEV_CHECK_GL_ERROR("Failed to bind resolve destination FBO as draw framebuffer");

        const FramebufferDesc& FBODesc = m_pBoundFramebuffer->GetDesc();
        m_ContextState.BlitFramebufferNoScissor(
            0, 0, static_cast<GLint>(FBODesc.Width), static_cast<GLint>(FBODesc.Height),
            0, 0, static_cast<GLint>(FBODesc.Width), static_cast<GLint>(FBODesc.Height),
            GL_COLOR_BUFFER_BIT,
            GL_NEAREST // Filter is ignored
        );
    }

    if (glInvalidateFramebuffer != nullptr)
    {
        // It is crucially important to invalidate the framebuffer while it is bound
        // https://community.arm.com/developer/tools-software/graphics/b/blog/posts/mali-performance-2-how-to-correctly-handle-framebuffers
        GLsizei InvalidateAttachmentsCount = 0;

        std::array<GLenum, MAX_RENDER_TARGETS + 1> InvalidateAttachments;
        for (Uint32 rt = 0; rt < SubpassDesc.RenderTargetAttachmentCount; ++rt)
        {
            const Uint32 RTAttachmentIdx = SubpassDesc.pRenderTargetAttachments[rt].AttachmentIndex;
            if (RTAttachmentIdx != ATTACHMENT_UNUSED)
            {
                auto AttachmentLastUse = m_pActiveRenderPass->GetAttachmentFirstLastUse(RTAttachmentIdx).second;
                if (AttachmentLastUse == m_SubpassIndex && RPDesc.pAttachments[RTAttachmentIdx].StoreOp == ATTACHMENT_STORE_OP_DISCARD)
                {
                    if (SubpassFBOs.RenderTarget == 0)
                    {
                        VERIFY(rt == 0, "Default framebuffer can only have single color attachment");
                        InvalidateAttachments[InvalidateAttachmentsCount++] = GL_COLOR;
                    }
                    else
                    {
                        InvalidateAttachments[InvalidateAttachmentsCount++] = GL_COLOR_ATTACHMENT0 + rt;
                    }
                }
            }
        }

        if (SubpassDesc.pDepthStencilAttachment != nullptr)
        {
            const Uint32 DSAttachmentIdx = SubpassDesc.pDepthStencilAttachment->AttachmentIndex;
            if (DSAttachmentIdx != ATTACHMENT_UNUSED)
            {
                auto AttachmentLastUse = m_pActiveRenderPass->GetAttachmentFirstLastUse(DSAttachmentIdx).second;
                if (AttachmentLastUse == m_SubpassIndex && RPDesc.pAttachments[DSAttachmentIdx].StoreOp == ATTACHMENT_STORE_OP_DISCARD)
                {
                    const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(RPDesc.pAttachments[DSAttachmentIdx].Format);
                    VERIFY_EXPR(FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH || FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL);
                    if (SubpassFBOs.RenderTarget == 0)
                    {
                        InvalidateAttachments[InvalidateAttachmentsCount++] = GL_DEPTH;
                        if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)
                            InvalidateAttachments[InvalidateAttachmentsCount++] = GL_STENCIL;
                    }
                    else
                    {
                        InvalidateAttachments[InvalidateAttachmentsCount++] = FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH ? GL_DEPTH_ATTACHMENT : GL_DEPTH_STENCIL_ATTACHMENT;
                    }
                }
            }
        }

        if (InvalidateAttachmentsCount > 0)
        {
            glInvalidateFramebuffer(GL_READ_FRAMEBUFFER, InvalidateAttachmentsCount, InvalidateAttachments.data());
            DEV_CHECK_GL_ERROR("glInvalidateFramebuffer() failed");
        }
    }

    // TODO: invalidate input attachments using glInvalidateTexImage

    m_ContextState.InvalidateFBO();
}